

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O2

void duckdb::CSVSniffFunction(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  *this;
  LogicalTypeId *pLVar1;
  pointer pLVar2;
  bool bVar3;
  uint value;
  GlobalTableFunctionState *pGVar4;
  FunctionData *pFVar5;
  FileSystem *this_00;
  CSVStateMachineCache *state_machine_cache_p;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  NotImplementedException *this_01;
  char opt;
  char opt_00;
  char opt_01;
  LogicalType *type;
  pointer pLVar11;
  LogicalType *c_type;
  ulong __n;
  long lVar12;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l;
  string separator;
  Value local_e50;
  CSVReaderOptions *local_e10;
  SnifferResult sniffer_result;
  vector<duckdb::Value,_true> values;
  __shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> local_db0;
  shared_ptr<duckdb::CSVBufferManager,_true> buffer_manager;
  string str_opt;
  vector<duckdb::OpenFileInfo,_true> files;
  string new_line_identifier;
  LogicalType local_d38;
  vector<duckdb::Value,_true> local_d20;
  ostringstream csv_read;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_ca8 [2];
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  ostringstream columns;
  string local_8d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_8b8;
  Value has_header;
  StrpTimeFormat timestamp_format;
  StrpTimeFormat date_format;
  CSVReaderOptions sniffer_options;
  MultiFileOptions file_options;
  CSVSniffer sniffer;
  
  pGVar4 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  if (*(char *)&pGVar4[1]._vptr_GlobalTableFunctionState == '\0') {
    pFVar5 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
    this_00 = FileSystem::GetFileSystem(context);
    FileSystem::GlobFiles(&files,this_00,(string *)(pFVar5 + 4),context,DISALLOW_EMPTY);
    if (1 < (ulong)(((long)files.
                           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                           .
                           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)files.
                          super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                          super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&sniffer_options,"sniff_csv does not operate on more than one file yet",
                 (allocator *)&sniffer);
      NotImplementedException::NotImplementedException(this_01,(string *)&sniffer_options);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_e10 = (CSVReaderOptions *)(pFVar5 + 8);
    CSVReaderOptions::CSVReaderOptions(&sniffer_options,local_e10);
    vector<duckdb::OpenFileInfo,_true>::get<true>(&files,0);
    ::std::__cxx11::string::_M_assign((string *)&sniffer_options.file_path);
    sniffer.all_fail_max_line_size = false;
    sniffer._1_3_ = 0;
    make_shared_ptr<duckdb::CSVBufferManager,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,int>
              ((ClientContext *)&buffer_manager,(CSVReaderOptions *)context,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sniffer_options
               ,(int *)&sniffer_options.file_path);
    if (sniffer_options.name_list.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        sniffer_options.name_list.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sniffer_options.name_list,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(pFVar5 + 0x8c));
    }
    if (sniffer_options.sql_type_list.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start ==
        sniffer_options.sql_type_list.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&sniffer_options.sql_type_list.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (pFVar5 + 0x89));
    }
    MultiFileOptions::MultiFileOptions(&file_options);
    ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_db0,
               (__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)&buffer_manager
              );
    state_machine_cache_p = CSVStateMachineCache::Get(context);
    CSVSniffer::CSVSniffer
              (&sniffer,&sniffer_options,&file_options,
               (shared_ptr<duckdb::CSVBufferManager,_true> *)&local_db0,state_machine_cache_p,true);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_db0._M_refcount);
    CSVSniffer::SniffCSV(&sniffer_result,&sniffer,*(bool *)&pFVar5[0x8f]._vptr_FunctionData);
    bVar3 = CSVSniffer::EmptyOrOnlyHeader(&sniffer);
    pLVar2 = sniffer_result.return_types.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar3) {
      for (pLVar11 = sniffer_result.return_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start; pLVar11 != pLVar2;
          pLVar11 = pLVar11 + 1) {
        LogicalType::LogicalType((LogicalType *)&columns,VARCHAR);
        LogicalType::operator=(pLVar11,(LogicalType *)&columns);
        LogicalType::~LogicalType((LogicalType *)&columns);
      }
    }
    str_opt._M_dataplus._M_p = (pointer)&str_opt.field_2;
    str_opt._M_string_length = 0;
    str_opt.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::string((string *)&separator,", ",(allocator *)&columns);
    output->count = 1;
    ::std::__cxx11::string::string
              ((string *)&columns,
               (string *)&sniffer_options.dialect_options.state_machine_options.delimiter.value);
    ::std::__cxx11::string::operator=((string *)&str_opt,(string *)&columns);
    ::std::__cxx11::string::~string((string *)&columns);
    ::std::__cxx11::string::string((string *)&local_a70,(string *)&str_opt);
    Value::Value((Value *)&columns,&local_a70);
    DataChunk::SetValue(output,0,0,(Value *)&columns);
    Value::~Value((Value *)&columns);
    ::std::__cxx11::string::~string((string *)&local_a70);
    CSVOption<char>::FormatValue_abi_cxx11_
              ((string *)&columns,&sniffer_options.dialect_options.state_machine_options.quote);
    ::std::__cxx11::string::operator=((string *)&str_opt,(string *)&columns);
    ::std::__cxx11::string::~string((string *)&columns);
    ::std::__cxx11::string::string((string *)&local_a90,(string *)&str_opt);
    Value::Value((Value *)&columns,&local_a90);
    DataChunk::SetValue(output,1,0,(Value *)&columns);
    Value::~Value((Value *)&columns);
    ::std::__cxx11::string::~string((string *)&local_a90);
    CSVOption<char>::FormatValue_abi_cxx11_
              ((string *)&columns,&sniffer_options.dialect_options.state_machine_options.escape);
    ::std::__cxx11::string::operator=((string *)&str_opt,(string *)&columns);
    ::std::__cxx11::string::~string((string *)&columns);
    ::std::__cxx11::string::string((string *)&local_ab0,(string *)&str_opt);
    Value::Value((Value *)&columns,&local_ab0);
    DataChunk::SetValue(output,2,0,(Value *)&columns);
    Value::~Value((Value *)&columns);
    ::std::__cxx11::string::~string((string *)&local_ab0);
    CSVReaderOptions::NewLineIdentifierToString_abi_cxx11_(&new_line_identifier,&sniffer_options);
    ::std::__cxx11::string::string((string *)&local_ad0,(string *)&new_line_identifier);
    Value::Value((Value *)&columns,&local_ad0);
    DataChunk::SetValue(output,3,0,(Value *)&columns);
    Value::~Value((Value *)&columns);
    ::std::__cxx11::string::~string((string *)&local_ad0);
    CSVOption<char>::FormatValue_abi_cxx11_
              ((string *)&columns,&sniffer_options.dialect_options.state_machine_options.comment);
    ::std::__cxx11::string::operator=((string *)&str_opt,(string *)&columns);
    ::std::__cxx11::string::~string((string *)&columns);
    ::std::__cxx11::string::string((string *)&local_af0,(string *)&str_opt);
    Value::Value((Value *)&columns,&local_af0);
    DataChunk::SetValue(output,4,0,(Value *)&columns);
    Value::~Value((Value *)&columns);
    ::std::__cxx11::string::~string((string *)&local_af0);
    value = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                      (sniffer_options.dialect_options.skip_rows.value);
    Value::UINTEGER((Value *)&columns,value);
    DataChunk::SetValue(output,5,0,(Value *)&columns);
    Value::~Value((Value *)&columns);
    Value::BOOLEAN(&has_header,sniffer_options.dialect_options.header.value);
    DataChunk::SetValue(output,6,0,&has_header);
    values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&columns);
    ::std::operator<<((ostream *)&columns,"{");
    for (__n = 0; __n < (ulong)(((long)sniffer_result.return_types.
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       .
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)sniffer_result.return_types.
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        __n = __n + 1) {
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&sniffer_result.names,__n);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::
      pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                  *)&csv_read,(char (*) [5])0x104ab6f,pvVar6);
      pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(&sniffer_result.return_types,__n);
      LogicalType::ToString_abi_cxx11_(&local_8d8,pvVar7);
      Value::Value((Value *)&date_format,&local_8d8);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::pair<const_char_(&)[5],_true>(local_ca8,(char (*) [5])0x103beeb,(Value *)&date_format);
      __l._M_len = 2;
      __l._M_array = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                      *)&csv_read;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)&timestamp_format,__l,(allocator_type *)&local_e50);
      lVar12 = 0x60;
      do {
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                 *)(&csv_read + lVar12));
        lVar12 = lVar12 + -0x60;
      } while (lVar12 != -0x60);
      Value::~Value((Value *)&date_format);
      ::std::__cxx11::string::~string((string *)&local_8d8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::vector(&local_8b8,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)&timestamp_format);
      Value::STRUCT((Value *)&csv_read,(child_list_t<Value> *)&local_8b8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values,(Value *)&csv_read
                );
      Value::~Value((Value *)&csv_read);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_8b8);
      poVar8 = ::std::operator<<((ostream *)&columns,"\'");
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&sniffer_result.names,__n);
      poVar8 = ::std::operator<<(poVar8,(string *)pvVar6);
      poVar8 = ::std::operator<<(poVar8,"\': \'");
      pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(&sniffer_result.return_types,__n);
      LogicalType::ToString_abi_cxx11_((string *)&csv_read,pvVar7);
      poVar8 = ::std::operator<<(poVar8,(string *)&csv_read);
      ::std::operator<<(poVar8,"\'");
      ::std::__cxx11::string::~string((string *)&csv_read);
      if (__n != ((long)sniffer_result.return_types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)sniffer_result.return_types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1U) {
        ::std::operator<<((ostream *)&columns,(string *)&separator);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)&timestamp_format);
    }
    ::std::operator<<((ostream *)&columns,"}");
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d20,
               &values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    Value::LIST((Value *)&csv_read,&local_d20);
    DataChunk::SetValue(output,7,0,(Value *)&csv_read);
    Value::~Value((Value *)&csv_read);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d20);
    this = &sniffer_options.dialect_options.date_format;
    pmVar9 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](this,&LogicalType::DATE);
    StrpTimeFormat::StrpTimeFormat(&date_format,&pmVar9->value);
    bVar3 = StrTimeFormat::Empty(&date_format.super_StrTimeFormat);
    pLVar2 = sniffer_result.return_types.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar3) {
      bVar3 = false;
      for (pLVar11 = sniffer_result.return_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start; pLVar11 != pLVar2;
          pLVar11 = pLVar11 + 1) {
        if (pLVar11->id_ == DATE) {
          Value::Value((Value *)&csv_read,"%Y-%m-%d");
          DataChunk::SetValue(output,8,0,(Value *)&csv_read);
          Value::~Value((Value *)&csv_read);
          bVar3 = true;
        }
      }
      if (!bVar3) {
        Value::Value((Value *)&csv_read,(nullptr_t)0x0);
        DataChunk::SetValue(output,8,0,(Value *)&csv_read);
        Value::~Value((Value *)&csv_read);
      }
    }
    else {
      ::std::__cxx11::string::string
                ((string *)&local_b10,(string *)&date_format.super_StrTimeFormat.format_specifier);
      Value::Value((Value *)&csv_read,&local_b10);
      DataChunk::SetValue(output,8,0,(Value *)&csv_read);
      Value::~Value((Value *)&csv_read);
      ::std::__cxx11::string::~string((string *)&local_b10);
    }
    pmVar9 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](this,&LogicalType::TIMESTAMP);
    StrpTimeFormat::StrpTimeFormat(&timestamp_format,&pmVar9->value);
    bVar3 = StrTimeFormat::Empty(&timestamp_format.super_StrTimeFormat);
    if (bVar3) {
      Value::Value((Value *)&csv_read,(nullptr_t)0x0);
      DataChunk::SetValue(output,9,0,(Value *)&csv_read);
      Value::~Value((Value *)&csv_read);
    }
    else {
      ::std::__cxx11::string::string
                ((string *)&local_b30,
                 (string *)&timestamp_format.super_StrTimeFormat.format_specifier);
      Value::Value((Value *)&csv_read,&local_b30);
      DataChunk::SetValue(output,9,0,(Value *)&csv_read);
      Value::~Value((Value *)&csv_read);
      ::std::__cxx11::string::~string((string *)&local_b30);
    }
    if (pFVar5[0x6a]._vptr_FunctionData == (_func_int **)0x0) {
      LogicalType::LogicalType(&local_d38,SQLNULL);
      Value::Value((Value *)&csv_read,&local_d38);
      DataChunk::SetValue(output,10,0,(Value *)&csv_read);
      Value::~Value((Value *)&csv_read);
      LogicalType::~LogicalType(&local_d38);
    }
    else {
      CSVReaderOptions::GetUserDefinedParameters_abi_cxx11_(&local_b50,local_e10);
      Value::Value((Value *)&csv_read,&local_b50);
      DataChunk::SetValue(output,10,0,(Value *)&csv_read);
      Value::~Value((Value *)&csv_read);
      ::std::__cxx11::string::~string((string *)&local_b50);
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&csv_read);
    poVar8 = ::std::operator<<((ostream *)&csv_read,"FROM read_csv(\'");
    pvVar10 = vector<duckdb::OpenFileInfo,_true>::get<true>(&files,0);
    poVar8 = ::std::operator<<(poVar8,(string *)pvVar10);
    poVar8 = ::std::operator<<(poVar8,"\'");
    poVar8 = ::std::operator<<(poVar8,(string *)&separator);
    poVar8 = ::std::operator<<(poVar8,"auto_detect=false");
    ::std::operator<<(poVar8,(string *)&separator);
    if (sniffer_options.dialect_options.state_machine_options.delimiter.set_by_user == false) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,"delim=");
      poVar8 = ::std::operator<<(poVar8,"\'");
      ::std::__cxx11::string::string
                ((string *)&local_b70,
                 (string *)&sniffer_options.dialect_options.state_machine_options.delimiter.value);
      FormatOptions((string *)&local_e50,&local_b70);
      poVar8 = ::std::operator<<(poVar8,(string *)&local_e50);
      poVar8 = ::std::operator<<(poVar8,"\'");
      ::std::operator<<(poVar8,(string *)&separator);
      ::std::__cxx11::string::~string((string *)&local_e50);
      ::std::__cxx11::string::~string((string *)&local_b70);
    }
    if (sniffer_options.dialect_options.state_machine_options.quote.set_by_user == false) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,"quote=");
      poVar8 = ::std::operator<<(poVar8,"\'");
      FormatOptions_abi_cxx11_
                ((string *)&local_e50,
                 (duckdb *)
                 (ulong)(uint)(int)sniffer_options.dialect_options.state_machine_options.quote.value
                 ,opt);
      poVar8 = ::std::operator<<(poVar8,(string *)&local_e50);
      poVar8 = ::std::operator<<(poVar8,"\'");
      ::std::operator<<(poVar8,(string *)&separator);
      ::std::__cxx11::string::~string((string *)&local_e50);
    }
    if (sniffer_options.dialect_options.state_machine_options.escape.set_by_user == false) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,"escape=");
      poVar8 = ::std::operator<<(poVar8,"\'");
      FormatOptions_abi_cxx11_
                ((string *)&local_e50,
                 (duckdb *)
                 (ulong)(uint)(int)sniffer_options.dialect_options.state_machine_options.escape.
                                   value,opt_00);
      poVar8 = ::std::operator<<(poVar8,(string *)&local_e50);
      poVar8 = ::std::operator<<(poVar8,"\'");
      ::std::operator<<(poVar8,(string *)&separator);
      ::std::__cxx11::string::~string((string *)&local_e50);
    }
    if ((sniffer_options.dialect_options.state_machine_options.new_line.set_by_user == false) &&
       (bVar3 = ::std::operator!=(&new_line_identifier,"mix"), bVar3)) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,"new_line=");
      poVar8 = ::std::operator<<(poVar8,"\'");
      poVar8 = ::std::operator<<(poVar8,(string *)&new_line_identifier);
      poVar8 = ::std::operator<<(poVar8,"\'");
      ::std::operator<<(poVar8,(string *)&separator);
    }
    if (sniffer_options.dialect_options.skip_rows.set_by_user == false) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,"skip=");
      poVar8 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      ::std::operator<<(poVar8,(string *)&separator);
    }
    if (sniffer_options.dialect_options.state_machine_options.comment.set_by_user == false) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,"comment=");
      poVar8 = ::std::operator<<(poVar8,"\'");
      FormatOptions_abi_cxx11_
                ((string *)&local_e50,
                 (duckdb *)
                 (ulong)(uint)(int)sniffer_options.dialect_options.state_machine_options.comment.
                                   value,opt_01);
      poVar8 = ::std::operator<<(poVar8,(string *)&local_e50);
      poVar8 = ::std::operator<<(poVar8,"\'");
      ::std::operator<<(poVar8,(string *)&separator);
      ::std::__cxx11::string::~string((string *)&local_e50);
    }
    if (sniffer_options.dialect_options.header.set_by_user == false) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,"header=");
      poVar8 = operator<<(poVar8,&has_header);
      ::std::operator<<(poVar8,(string *)&separator);
    }
    poVar8 = ::std::operator<<((ostream *)&csv_read,"columns=");
    ::std::__cxx11::stringbuf::str();
    ::std::operator<<(poVar8,(string *)&local_e50);
    ::std::__cxx11::string::~string((string *)&local_e50);
    pmVar9 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](this,&LogicalType::DATE);
    if (pmVar9->set_by_user == false) {
      pmVar9 = ::std::
               map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
               ::operator[](this,&LogicalType::DATE);
      if ((pmVar9->value).super_StrTimeFormat.format_specifier._M_string_length == 0) {
        do {
          if (sniffer_result.return_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start ==
              sniffer_result.return_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_0088ae35;
          pLVar1 = &(sniffer_result.return_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start)->id_;
          sniffer_result.return_types.
          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start =
               sniffer_result.return_types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start + 1;
        } while (*pLVar1 != DATE);
        poVar8 = ::std::operator<<((ostream *)&csv_read,(string *)&separator);
        poVar8 = ::std::operator<<(poVar8,"dateformat=");
        ::std::operator<<(poVar8,"\'%Y-%m-%d\'");
      }
      else {
        poVar8 = ::std::operator<<((ostream *)&csv_read,(string *)&separator);
        poVar8 = ::std::operator<<(poVar8,"dateformat=");
        poVar8 = ::std::operator<<(poVar8,"\'");
        pmVar9 = ::std::
                 map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                 ::operator[](this,&LogicalType::DATE);
        poVar8 = ::std::operator<<(poVar8,(string *)
                                          &(pmVar9->value).super_StrTimeFormat.format_specifier);
        ::std::operator<<(poVar8,"\'");
      }
    }
LAB_0088ae35:
    pmVar9 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](this,&LogicalType::TIMESTAMP);
    if ((pmVar9->set_by_user == false) &&
       (pmVar9 = ::std::
                 map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                 ::operator[](this,&LogicalType::TIMESTAMP),
       (pmVar9->value).super_StrTimeFormat.format_specifier._M_string_length != 0)) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,(string *)&separator);
      poVar8 = ::std::operator<<(poVar8,"timestampformat=");
      poVar8 = ::std::operator<<(poVar8,"\'");
      pmVar9 = ::std::
               map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
               ::operator[](this,&LogicalType::TIMESTAMP);
      poVar8 = ::std::operator<<(poVar8,(string *)
                                        &(pmVar9->value).super_StrTimeFormat.format_specifier);
      ::std::operator<<(poVar8,"\'");
    }
    if (pFVar5[0x6a]._vptr_FunctionData != (_func_int **)0x0) {
      poVar8 = ::std::operator<<((ostream *)&csv_read,(string *)&separator);
      CSVReaderOptions::GetUserDefinedParameters_abi_cxx11_((string *)&local_e50,local_e10);
      ::std::operator<<(poVar8,(string *)&local_e50);
      ::std::__cxx11::string::~string((string *)&local_e50);
    }
    ::std::operator<<((ostream *)&csv_read,");");
    ::std::__cxx11::stringbuf::str();
    Value::Value(&local_e50,&local_b90);
    DataChunk::SetValue(output,0xb,0,&local_e50);
    Value::~Value(&local_e50);
    ::std::__cxx11::string::~string((string *)&local_b90);
    *(undefined1 *)&pGVar4[1]._vptr_GlobalTableFunctionState = 1;
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&csv_read);
    StrTimeFormat::~StrTimeFormat(&timestamp_format.super_StrTimeFormat);
    StrTimeFormat::~StrTimeFormat(&date_format.super_StrTimeFormat);
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&columns);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values);
    Value::~Value(&has_header);
    ::std::__cxx11::string::~string((string *)&new_line_identifier);
    ::std::__cxx11::string::~string((string *)&separator);
    ::std::__cxx11::string::~string((string *)&str_opt);
    SnifferResult::~SnifferResult(&sniffer_result);
    CSVSniffer::~CSVSniffer(&sniffer);
    MultiFileOptions::~MultiFileOptions(&file_options);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&buffer_manager.internal.
                super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    CSVReaderOptions::~CSVReaderOptions(&sniffer_options);
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              (&files.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>);
  }
  return;
}

Assistant:

static void CSVSniffFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &global_state = data_p.global_state->Cast<CSVSniffGlobalState>();
	// Are we done?
	if (global_state.done) {
		return;
	}
	const CSVSniffFunctionData &data = data_p.bind_data->Cast<CSVSniffFunctionData>();
	auto &fs = duckdb::FileSystem::GetFileSystem(context);

	auto files = fs.GlobFiles(data.path, context, FileGlobOptions::DISALLOW_EMPTY);
	if (files.size() > 1) {
		throw NotImplementedException("sniff_csv does not operate on more than one file yet");
	}

	// We must run the sniffer.
	auto sniffer_options = data.options;
	sniffer_options.file_path = files[0].path;

	auto buffer_manager = make_shared_ptr<CSVBufferManager>(context, sniffer_options, sniffer_options.file_path, 0);
	if (sniffer_options.name_list.empty()) {
		sniffer_options.name_list = data.names_csv;
	}

	if (sniffer_options.sql_type_list.empty()) {
		sniffer_options.sql_type_list = data.return_types_csv;
	}
	MultiFileOptions file_options;
	CSVSniffer sniffer(sniffer_options, file_options, buffer_manager, CSVStateMachineCache::Get(context));
	auto sniffer_result = sniffer.SniffCSV(data.force_match);
	if (sniffer.EmptyOrOnlyHeader()) {
		for (auto &type : sniffer_result.return_types) {
			D_ASSERT(type.id() == LogicalTypeId::BOOLEAN);
			// we default to varchar if all files are empty or only have a header after all the sniffing
			type = LogicalType::VARCHAR;
		}
	}
	string str_opt;
	string separator = ", ";
	// Set output
	output.SetCardinality(1);

	// 1. Delimiter
	str_opt = sniffer_options.dialect_options.state_machine_options.delimiter.FormatValue();
	output.SetValue(0, 0, str_opt);
	// 2. Quote
	str_opt = sniffer_options.dialect_options.state_machine_options.quote.FormatValue();
	output.SetValue(1, 0, str_opt);
	// 3. Escape
	str_opt = sniffer_options.dialect_options.state_machine_options.escape.FormatValue();
	output.SetValue(2, 0, str_opt);
	// 4. NewLine Delimiter
	auto new_line_identifier = sniffer_options.NewLineIdentifierToString();
	output.SetValue(3, 0, new_line_identifier);
	// 5. Comment
	str_opt = sniffer_options.dialect_options.state_machine_options.comment.FormatValue();
	output.SetValue(4, 0, str_opt);
	// 6. Skip Rows
	output.SetValue(5, 0, Value::UINTEGER(NumericCast<uint32_t>(sniffer_options.dialect_options.skip_rows.GetValue())));
	// 7. Has Header
	auto has_header = Value::BOOLEAN(sniffer_options.dialect_options.header.GetValue());
	output.SetValue(6, 0, has_header);
	// 8. List<Struct<Column-Name:Types>> {'col1': 'INTEGER', 'col2': 'VARCHAR'}
	vector<Value> values;
	std::ostringstream columns;
	columns << "{";
	for (idx_t i = 0; i < sniffer_result.return_types.size(); i++) {
		child_list_t<Value> struct_children {{"name", sniffer_result.names[i]},
		                                     {"type", {sniffer_result.return_types[i].ToString()}}};
		values.emplace_back(Value::STRUCT(struct_children));
		columns << "'" << sniffer_result.names[i] << "': '" << sniffer_result.return_types[i].ToString() << "'";
		if (i != sniffer_result.return_types.size() - 1) {
			columns << separator;
		}
	}
	columns << "}";
	output.SetValue(7, 0, Value::LIST(values));
	// 9. Date Format
	auto date_format = sniffer_options.dialect_options.date_format[LogicalType::DATE].GetValue();
	if (!date_format.Empty()) {
		output.SetValue(8, 0, date_format.format_specifier);
	} else {
		bool has_date = false;
		for (auto &c_type : sniffer_result.return_types) {
			// Must be ISO 8601
			if (c_type.id() == LogicalTypeId::DATE) {
				output.SetValue(8, 0, Value("%Y-%m-%d"));
				has_date = true;
			}
		}
		if (!has_date) {
			output.SetValue(8, 0, Value(nullptr));
		}
	}

	// 10. Timestamp Format
	auto timestamp_format = sniffer_options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue();
	if (!timestamp_format.Empty()) {
		output.SetValue(9, 0, timestamp_format.format_specifier);
	} else {
		output.SetValue(9, 0, Value(nullptr));
	}

	// 11. The Extra User Arguments
	if (data.options.user_defined_parameters.empty()) {
		output.SetValue(10, 0, Value());
	} else {
		output.SetValue(10, 0, Value(data.options.GetUserDefinedParameters()));
	}

	// 12. csv_read string
	std::ostringstream csv_read;

	// Base, Path and auto_detect=false
	csv_read << "FROM read_csv('" << files[0].path << "'" << separator << "auto_detect=false" << separator;
	// 10.1. Delimiter
	if (!sniffer_options.dialect_options.state_machine_options.delimiter.IsSetByUser()) {
		csv_read << "delim="
		         << "'" << FormatOptions(sniffer_options.dialect_options.state_machine_options.delimiter.GetValue())
		         << "'" << separator;
	}
	// 11.2. Quote
	if (!sniffer_options.dialect_options.state_machine_options.quote.IsSetByUser()) {
		csv_read << "quote="
		         << "'" << FormatOptions(sniffer_options.dialect_options.state_machine_options.quote.GetValue()) << "'"
		         << separator;
	}
	// 11.3. Escape
	if (!sniffer_options.dialect_options.state_machine_options.escape.IsSetByUser()) {
		csv_read << "escape="
		         << "'" << FormatOptions(sniffer_options.dialect_options.state_machine_options.escape.GetValue()) << "'"
		         << separator;
	}
	// 11.4. NewLine Delimiter
	if (!sniffer_options.dialect_options.state_machine_options.new_line.IsSetByUser()) {
		if (new_line_identifier != "mix") {
			csv_read << "new_line="
			         << "'" << new_line_identifier << "'" << separator;
		}
	}
	// 11.5. Skip Rows
	if (!sniffer_options.dialect_options.skip_rows.IsSetByUser()) {
		csv_read << "skip=" << sniffer_options.dialect_options.skip_rows.GetValue() << separator;
	}

	// 11.6. Comment
	if (!sniffer_options.dialect_options.state_machine_options.comment.IsSetByUser()) {
		csv_read << "comment="
		         << "'" << FormatOptions(sniffer_options.dialect_options.state_machine_options.comment.GetValue())
		         << "'" << separator;
	}

	// 11.7. Has Header
	if (!sniffer_options.dialect_options.header.IsSetByUser()) {
		csv_read << "header=" << has_header << separator;
	}
	// 11.8. column={'col1': 'INTEGER', 'col2': 'VARCHAR'}
	csv_read << "columns=" << columns.str();
	// 11.9. Date Format
	if (!sniffer_options.dialect_options.date_format[LogicalType::DATE].IsSetByUser()) {
		if (!sniffer_options.dialect_options.date_format[LogicalType::DATE].GetValue().format_specifier.empty()) {
			csv_read << separator << "dateformat="
			         << "'"
			         << sniffer_options.dialect_options.date_format[LogicalType::DATE].GetValue().format_specifier
			         << "'";
		} else {
			for (auto &c_type : sniffer_result.return_types) {
				// Must be ISO 8601
				if (c_type.id() == LogicalTypeId::DATE) {
					csv_read << separator << "dateformat="
					         << "'%Y-%m-%d'";
					break;
				}
			}
		}
	}
	// 11.10. Timestamp Format
	if (!sniffer_options.dialect_options.date_format[LogicalType::TIMESTAMP].IsSetByUser()) {
		if (!sniffer_options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue().format_specifier.empty()) {
			csv_read << separator << "timestampformat="
			         << "'"
			         << sniffer_options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue().format_specifier
			         << "'";
		}
	}
	// 11.11 User Arguments
	if (!data.options.user_defined_parameters.empty()) {
		csv_read << separator << data.options.GetUserDefinedParameters();
	}
	csv_read << ");";
	output.SetValue(11, 0, csv_read.str());
	global_state.done = true;
}